

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_serialization.hpp
# Opt level: O2

AggregateFunction * __thiscall
duckdb::FunctionSerializer::
DeserializeFunction<duckdb::AggregateFunction,duckdb::AggregateFunctionCatalogEntry>
          (AggregateFunction *__return_storage_ptr__,FunctionSerializer *this,ClientContext *context
          ,CatalogType catalog_type,string *name,vector<duckdb::LogicalType,_true> *arguments,
          vector<duckdb::LogicalType,_true> *original_arguments)

{
  CatalogEntry *pCVar1;
  InternalException *this_00;
  undefined7 in_register_00000009;
  string *arguments_00;
  allocator local_ba;
  allocator local_b9;
  string *local_b8;
  string local_b0;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  EntryLookupInfo lookup_info;
  
  local_b8 = (string *)CONCAT71(in_register_00000009,catalog_type);
  EntryLookupInfo::EntryLookupInfo
            (&lookup_info,(CatalogType)context,local_b8,(QueryErrorContext)0xffffffffffffffff);
  ::std::__cxx11::string::string((string *)&local_b0,"system",&local_b9);
  ::std::__cxx11::string::string((string *)&local_90,"main",&local_ba);
  pCVar1 = Catalog::GetEntry((ClientContext *)this,&local_b0,&local_90,&lookup_info);
  ::std::__cxx11::string::~string((string *)&local_90);
  ::std::__cxx11::string::~string((string *)&local_b0);
  if (pCVar1->type == (CatalogType)context) {
    arguments_00 = (string *)arguments;
    if ((arguments->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
        super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
        super__Vector_impl_data._M_start ==
        (arguments->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
        super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      arguments_00 = name;
    }
    AggregateFunctionSet::GetFunctionByArguments
              (__return_storage_ptr__,(AggregateFunctionSet *)&pCVar1[1].comment.value_info_,
               (ClientContext *)this,(vector<duckdb::LogicalType,_true> *)arguments_00);
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::_M_move_assign
              (&(__return_storage_ptr__->super_BaseScalarFunction).super_SimpleFunction.arguments.
                super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>,name);
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::_M_move_assign
              (&(__return_storage_ptr__->super_BaseScalarFunction).super_SimpleFunction.
                original_arguments.
                super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>,arguments);
    return __return_storage_ptr__;
  }
  this_00 = (InternalException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&local_b0,"DeserializeFunction - cant find catalog entry for function %s",
             (allocator *)&local_90);
  ::std::__cxx11::string::string((string *)&local_70,(string *)local_b8);
  InternalException::InternalException<std::__cxx11::string>(this_00,&local_b0,&local_70);
  __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

static FUNC DeserializeFunction(ClientContext &context, CatalogType catalog_type, const string &name,
	                                vector<LogicalType> arguments, vector<LogicalType> original_arguments) {
		EntryLookupInfo lookup_info(catalog_type, name);
		auto &func_catalog = Catalog::GetEntry(context, SYSTEM_CATALOG, DEFAULT_SCHEMA, lookup_info);
		if (func_catalog.type != catalog_type) {
			throw InternalException("DeserializeFunction - cant find catalog entry for function %s", name);
		}
		auto &functions = func_catalog.Cast<CATALOG_ENTRY>();
		auto function = functions.functions.GetFunctionByArguments(
		    context, original_arguments.empty() ? arguments : original_arguments);
		function.arguments = std::move(arguments);
		function.original_arguments = std::move(original_arguments);
		return function;
	}